

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FFont::~FFont(FFont *this)

{
  int iVar1;
  int iVar2;
  FTexture *pFVar3;
  char *pcVar4;
  FFont *local_28;
  FFont *font;
  FFont **prev;
  int i;
  int count;
  FFont *this_local;
  
  this->_vptr_FFont = (_func_int **)&PTR__FFont_009fd290;
  if (this->Chars != (CharData *)0x0) {
    iVar1 = this->LastChar;
    iVar2 = this->FirstChar;
    for (prev._0_4_ = 0; (int)prev < (iVar1 - iVar2) + 1; prev._0_4_ = (int)prev + 1) {
      if (((this->Chars[(int)prev].Pic != (FTexture *)0x0) &&
          (pcVar4 = FString::operator[](&(this->Chars[(int)prev].Pic)->Name,0), *pcVar4 == '\0')) &&
         (pFVar3 = this->Chars[(int)prev].Pic, pFVar3 != (FTexture *)0x0)) {
        (*pFVar3->_vptr_FTexture[1])();
      }
    }
    if (this->Chars != (CharData *)0x0) {
      operator_delete__(this->Chars);
    }
    this->Chars = (CharData *)0x0;
  }
  if (this->PatchRemap != (BYTE *)0x0) {
    if (this->PatchRemap != (BYTE *)0x0) {
      operator_delete__(this->PatchRemap);
    }
    this->PatchRemap = (BYTE *)0x0;
  }
  if (this->Name != (char *)0x0) {
    if (this->Name != (char *)0x0) {
      operator_delete__(this->Name);
    }
    this->Name = (char *)0x0;
  }
  font = (FFont *)&FirstFont;
  local_28 = FirstFont;
  while (local_28 != (FFont *)0x0 && local_28 != this) {
    font = (FFont *)&local_28->Next;
    local_28 = *(FFont **)font;
  }
  if (local_28 != (FFont *)0x0) {
    font->_vptr_FFont = (_func_int **)local_28->Next;
  }
  TArray<FRemapTable,_FRemapTable>::~TArray(&this->Ranges);
  return;
}

Assistant:

FFont::~FFont ()
{
	if (Chars)
	{
		int count = LastChar - FirstChar + 1;

		for (int i = 0; i < count; ++i)
		{
			if (Chars[i].Pic != NULL && Chars[i].Pic->Name[0] == 0)
			{
				delete Chars[i].Pic;
			}
		}
		delete[] Chars;
		Chars = NULL;
	}
	if (PatchRemap)
	{
		delete[] PatchRemap;
		PatchRemap = NULL;
	}
	if (Name)
	{
		delete[] Name;
		Name = NULL;
	}

	FFont **prev = &FirstFont;
	FFont *font = *prev;

	while (font != NULL && font != this)
	{
		prev = &font->Next;
		font = *prev;
	}

	if (font != NULL)
	{
		*prev = font->Next;
	}
}